

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_DeleteSubscriptions
               (UA_Server *server,UA_Session *session,UA_DeleteSubscriptionsRequest *request,
               UA_DeleteSubscriptionsResponse *response)

{
  UA_StatusCode UVar1;
  UA_StatusCode *pUVar2;
  UA_NodeId *dst;
  uint local_c0;
  uint local_b8;
  uint local_b4;
  uint local_98;
  uint local_90;
  uint local_8c;
  uint local_78;
  uint local_70;
  uint local_6c;
  UA_NodeId *sessionToken;
  size_t i;
  UA_DeleteSubscriptionsResponse *response_local;
  UA_DeleteSubscriptionsRequest *request_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_70 = 0;
  }
  else {
    if (session->channel->connection == (UA_Connection *)0x0) {
      local_6c = 0;
    }
    else {
      local_6c = session->channel->connection->sockfd;
    }
    local_70 = local_6c;
  }
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = (session->channel->securityToken).channelId;
  }
  UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
               "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Processing DeleteSubscriptionsRequest"
               ,(ulong)local_70,(ulong)local_78,(ulong)(session->sessionId).identifier.numeric,
               (uint)(session->sessionId).identifier.guid.data2,
               (uint)(session->sessionId).identifier.guid.data3,
               (uint)(session->sessionId).identifier.guid.data4[0],
               (uint)(session->sessionId).identifier.guid.data4[1],
               (uint)(session->sessionId).identifier.guid.data4[2],
               (uint)(session->sessionId).identifier.guid.data4[3],
               (uint)(session->sessionId).identifier.guid.data4[4],
               (uint)(session->sessionId).identifier.guid.data4[5],
               (uint)(session->sessionId).identifier.guid.data4[6],
               (uint)(session->sessionId).identifier.guid.data4[7]);
  if (request->subscriptionIdsSize == 0) {
    (response->responseHeader).serviceResult = 0x800f0000;
  }
  else {
    pUVar2 = (UA_StatusCode *)malloc(request->subscriptionIdsSize << 2);
    response->results = pUVar2;
    if (response->results == (UA_StatusCode *)0x0) {
      (response->responseHeader).serviceResult = 0x80030000;
    }
    else {
      response->resultsSize = request->subscriptionIdsSize;
      for (sessionToken = (UA_NodeId *)0x0; sessionToken < (UA_NodeId *)request->subscriptionIdsSize
          ; sessionToken = (UA_NodeId *)((long)&sessionToken->namespaceIndex + 1)) {
        UVar1 = UA_Session_deleteSubscription
                          (server,session,request->subscriptionIds[(long)sessionToken]);
        response->results[(long)sessionToken] = UVar1;
        if (response->results[(long)sessionToken] == 0) {
          if (session->channel == (UA_SecureChannel *)0x0) {
            local_90 = 0;
          }
          else {
            if (session->channel->connection == (UA_Connection *)0x0) {
              local_8c = 0;
            }
            else {
              local_8c = session->channel->connection->sockfd;
            }
            local_90 = local_8c;
          }
          if (session->channel == (UA_SecureChannel *)0x0) {
            local_98 = 0;
          }
          else {
            local_98 = (session->channel->securityToken).channelId;
          }
          UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
                       "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Subscription deleted"
                       ,(ulong)local_90,(ulong)local_98,
                       (ulong)(session->sessionId).identifier.numeric,
                       (uint)(session->sessionId).identifier.guid.data2,
                       (uint)(session->sessionId).identifier.guid.data3,
                       (uint)(session->sessionId).identifier.guid.data4[0],
                       (uint)(session->sessionId).identifier.guid.data4[1],
                       (uint)(session->sessionId).identifier.guid.data4[2],
                       (uint)(session->sessionId).identifier.guid.data4[3],
                       (uint)(session->sessionId).identifier.guid.data4[4],
                       (uint)(session->sessionId).identifier.guid.data4[5],
                       (uint)(session->sessionId).identifier.guid.data4[6],
                       (uint)(session->sessionId).identifier.guid.data4[7],
                       request->subscriptionIds[(long)sessionToken]);
        }
        else {
          if (session->channel == (UA_SecureChannel *)0x0) {
            local_b8 = 0;
          }
          else {
            if (session->channel->connection == (UA_Connection *)0x0) {
              local_b4 = 0;
            }
            else {
              local_b4 = session->channel->connection->sockfd;
            }
            local_b8 = local_b4;
          }
          if (session->channel == (UA_SecureChannel *)0x0) {
            local_c0 = 0;
          }
          else {
            local_c0 = (session->channel->securityToken).channelId;
          }
          UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
                       "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Deleting Subscription with Id %u failed with error code 0x%08x"
                       ,(ulong)local_b8,(ulong)local_c0,
                       (ulong)(session->sessionId).identifier.numeric,
                       (uint)(session->sessionId).identifier.guid.data2,
                       (uint)(session->sessionId).identifier.guid.data3,
                       (uint)(session->sessionId).identifier.guid.data4[0],
                       (uint)(session->sessionId).identifier.guid.data4[1],
                       (uint)(session->sessionId).identifier.guid.data4[2],
                       (uint)(session->sessionId).identifier.guid.data4[3],
                       (uint)(session->sessionId).identifier.guid.data4[4],
                       (uint)(session->sessionId).identifier.guid.data4[5],
                       (uint)(session->sessionId).identifier.guid.data4[6],
                       (uint)(session->sessionId).identifier.guid.data4[7],
                       request->subscriptionIds[(long)sessionToken],
                       response->results[(long)sessionToken]);
        }
      }
      if (((session->serverSubscriptions).lh_first == (UA_Subscription *)0x0) &&
         (dst = UA_NodeId_new(), dst != (UA_NodeId *)0x0)) {
        UA_NodeId_copy(&session->authenticationToken,dst);
        UA_Server_delayedCallback(server,UA_Subscription_answerPublishRequestsNoSubscription,dst);
      }
    }
  }
  return;
}

Assistant:

void
Service_DeleteSubscriptions(UA_Server *server, UA_Session *session,
                            const UA_DeleteSubscriptionsRequest *request,
                            UA_DeleteSubscriptionsResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing DeleteSubscriptionsRequest");

    if(request->subscriptionIdsSize == 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_malloc(sizeof(UA_StatusCode) * request->subscriptionIdsSize);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->subscriptionIdsSize;

    for(size_t i = 0; i < request->subscriptionIdsSize; ++i) {
        response->results[i] = UA_Session_deleteSubscription(server, session, request->subscriptionIds[i]);
        if(response->results[i] == UA_STATUSCODE_GOOD) {
            UA_LOG_DEBUG_SESSION(server->config.logger, session, "Subscription %u | "
                                "Subscription deleted", request->subscriptionIds[i]);
        } else {
            UA_LOG_DEBUG_SESSION(server->config.logger, session, "Deleting Subscription with Id "
                                 "%u failed with error code 0x%08x", request->subscriptionIds[i],
                                 response->results[i]);
        }
    }

    /* Send dangling publish responses in a delayed job if the last subscription
       was removed */
    if(LIST_FIRST(&session->serverSubscriptions))
        return;
    UA_NodeId *sessionToken = UA_NodeId_new();
    if(!sessionToken)
        return;
    UA_NodeId_copy(&session->authenticationToken, sessionToken);
    UA_Server_delayedCallback(server, (UA_ServerCallback)UA_Subscription_answerPublishRequestsNoSubscription,
                              sessionToken);
}